

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

void cft_fasttext_free(fasttext_t *handle)

{
  FastText *x;
  
  if (handle != (fasttext_t *)0x0) {
    if (*(long *)(handle + 0x78) != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (*(long **)(handle + 0x70) != (long *)0x0) {
      (**(code **)(**(long **)(handle + 0x70) + 8))();
    }
    *(undefined8 *)(handle + 0x70) = 0;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x48) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x48));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x38) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x38));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x28) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x28));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x18) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 0x18));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(handle + 8));
    }
    operator_delete(handle);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_free(fasttext_t* handle) {
    FastText* x = (FastText*)handle;
    delete x;
}